

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_string.cpp
# Opt level: O0

bool __thiscall Am_String::operator==(Am_String *this,char *test_string)

{
  int iVar1;
  char *__s1;
  char *string;
  char *test_string_local;
  Am_String *this_local;
  
  if (test_string == (char *)0x0) {
    this_local._7_1_ = this->data == (Am_String_Data *)0x0;
  }
  else if (this->data == (Am_String_Data *)0x0) {
    this_local._7_1_ = test_string == (char *)0x0;
  }
  else {
    __s1 = Am_String_Data::operator_cast_to_char_(this->data);
    this_local._7_1_ = true;
    if (__s1 != test_string) {
      iVar1 = strcmp(__s1,test_string);
      this_local._7_1_ = iVar1 == 0;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
Am_String::operator==(const char *test_string) const
{
  if (test_string) {
    if (data) {
      const char *string = *data;
      return (string == test_string) || !strcmp(string, test_string);
    } else
      return test_string == nullptr;
  } else
    return data == nullptr;
}